

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PFlushLineSmart(TidyDocImpl *doc,uint indent)

{
  uint *puVar1;
  
  if ((doc->pprint).linelen != 0) {
    PFlushLineImpl(doc);
  }
  if (*(int *)((doc->config).value + 0x57) != 2) {
    prvTidyWriteChar(10,doc->docOut);
    puVar1 = &(doc->pprint).line;
    *puVar1 = *puVar1 + 1;
  }
  if ((doc->pprint).indent[0].spaces != indent) {
    (doc->pprint).indent[0].spaces = indent;
  }
  return;
}

Assistant:

static void PFlushLineSmart( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;

    if ( pprint->linelen > 0 )
        PFlushLineImpl( doc );

    /* Issue #228 - cfgBool( doc, TidyVertSpace ); */
    if(TidyAddVS) {
        TY_(WriteChar)( '\n', doc->docOut );
        pprint->line++;
    }

    if ( pprint->indent[ 0 ].spaces != (int)indent )
    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
        pprint->indent[ 0 ].spaces = indent;
    }
}